

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  uint64_t *puVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  int *piVar8;
  size_t sVar9;
  long lVar10;
  secp256k1_ge *psVar11;
  secp256k1_gej *a_00;
  secp256k1_fe *b;
  size_t sVar12;
  bool bVar13;
  secp256k1_fe u;
  
  a_00 = a;
  sVar12 = len;
  while (bVar13 = sVar12 != 0, sVar12 = sVar12 - 1, bVar13) {
    secp256k1_gej_verify(a_00);
    a_00 = a_00 + 1;
  }
  b = &a->z;
  sVar12 = 0xffffffffffffffff;
  psVar11 = r;
  for (sVar9 = 0; len != sVar9; sVar9 = sVar9 + 1) {
    if ((int)b[1].n[0] == 0) {
      if (sVar12 == 0xffffffffffffffff) {
        uVar3 = b->n[0];
        uVar4 = b->n[1];
        uVar5 = b->n[2];
        uVar6 = b->n[3];
        iVar2 = b->magnitude;
        iVar7 = b->normalized;
        (psVar11->x).n[4] = b->n[4];
        (psVar11->x).magnitude = iVar2;
        (psVar11->x).normalized = iVar7;
        (psVar11->x).n[2] = uVar5;
        (psVar11->x).n[3] = uVar6;
        (psVar11->x).n[0] = uVar3;
        (psVar11->x).n[1] = uVar4;
        sVar12 = sVar9;
      }
      else {
        secp256k1_fe_mul(&psVar11->x,&r[sVar12].x,b);
        sVar12 = sVar9;
      }
    }
    else {
      secp256k1_ge_set_infinity(psVar11);
    }
    b = (secp256k1_fe *)(b[3].n + 1);
    psVar11 = psVar11 + 1;
  }
  if (sVar12 != 0xffffffffffffffff) {
    secp256k1_fe_inv_var(&u,&r[sVar12].x);
    do {
      lVar10 = -sVar12;
      psVar11 = r + sVar12;
      piVar8 = &a[sVar12 - 1].infinity;
      do {
        lVar10 = lVar10 + 1;
        if (lVar10 == 1) {
          if (a[sVar12].infinity == 0) {
            puVar1 = r[sVar12].x.n + 4;
            *puVar1 = u.n[4];
            puVar1[1] = u._40_8_;
            puVar1 = r[sVar12].x.n + 2;
            *puVar1 = u.n[2];
            puVar1[1] = u.n[3];
            r[sVar12].x.n[0] = u.n[0];
            r[sVar12].x.n[1] = u.n[1];
            psVar11 = r;
            sVar12 = len;
            while (bVar13 = sVar12 != 0, sVar12 = sVar12 - 1, bVar13) {
              if (a->infinity == 0) {
                secp256k1_ge_set_gej_zinv(psVar11,a,&psVar11->x);
              }
              a = a + 1;
              psVar11 = psVar11 + 1;
            }
            while (bVar13 = len != 0, len = len - 1, bVar13) {
              secp256k1_ge_verify(r);
              r = r + 1;
            }
            return;
          }
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/group_impl.h"
                  ,0xeb,"test condition failed: !a[last_i].infinity");
          abort();
        }
        psVar11 = psVar11 + -1;
        iVar2 = *piVar8;
        piVar8 = piVar8 + -0x26;
      } while (iVar2 != 0);
      secp256k1_fe_mul(&r[sVar12].x,&psVar11->x,&u);
      secp256k1_fe_mul(&u,&u,&a[sVar12].z);
      sVar12 = -lVar10;
    } while( true );
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
    }
#endif

    for (i = 0; i < len; i++) {
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}